

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O0

DWORD Memory::RecyclerHeuristic::BackgroundFinishMarkWaitTime
                (bool backgroundFinishMarkWaitTime,ConfigFlagsTable *flags)

{
  bool bVar1;
  byte local_19;
  ConfigFlagsTable *flags_local;
  bool backgroundFinishMarkWaitTime_local;
  
  local_19 = 0;
  if (backgroundFinishMarkWaitTime) {
    bVar1 = Js::Phases::IsEnabled(&flags->Off,BackgroundFinishMarkPhase);
    local_19 = bVar1 ^ 0xff;
  }
  if (((local_19 & 1) == 0) &&
     (bVar1 = Js::Phases::IsEnabled(&flags->Force,BackgroundFinishMarkPhase), !bVar1)) {
    return 0xffffffff;
  }
  bVar1 = Js::ConfigFlagsTable::IsEnabled(flags,BackgroundFinishMarkWaitTimeFlag);
  if (bVar1) {
    flags_local._4_4_ = flags->BackgroundFinishMarkWaitTime;
  }
  else {
    bVar1 = Js::Phases::IsEnabled(&flags->Force,BackgroundFinishMarkPhase);
    if (bVar1) {
      flags_local._4_4_ = 0xffffffff;
    }
    else {
      flags_local._4_4_ = 0xf;
    }
  }
  return flags_local._4_4_;
}

Assistant:

DWORD
RecyclerHeuristic::BackgroundFinishMarkWaitTime(bool backgroundFinishMarkWaitTime, Js::ConfigFlagsTable& flags)
{
    if (RECYCLER_HEURISTIC_VERSION == 10)
    {
        backgroundFinishMarkWaitTime = backgroundFinishMarkWaitTime && CUSTOM_PHASE_ON1(flags, Js::BackgroundFinishMarkPhase);
    }
    else
    {
        backgroundFinishMarkWaitTime = backgroundFinishMarkWaitTime && !CUSTOM_PHASE_OFF1(flags, Js::BackgroundFinishMarkPhase);
    }
    if (!backgroundFinishMarkWaitTime && !CUSTOM_PHASE_FORCE1(flags, Js::BackgroundFinishMarkPhase))
    {
        return INFINITE;
    }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (flags.IsEnabled(Js::BackgroundFinishMarkWaitTimeFlag))
    {
        return flags.BackgroundFinishMarkWaitTime;
    }
#endif
    if (CUSTOM_PHASE_FORCE1(flags, Js::BackgroundFinishMarkPhase))
    {
        return INFINITE;
    }
    return DefaultBackgroundFinishMarkWaitTime;
}